

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMPhysicalUsedByCurrentProcessPeak(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char local_a8 [8];
  char line [128];
  FILE *file;
  int64_t result;
  int BufferSize;
  
  file = (FILE *)0x0;
  __stream = fopen("/proc/self/status","r");
  while (pcVar2 = fgets(local_a8,0x80,__stream), pcVar2 != (char *)0x0) {
    iVar1 = strncmp(local_a8,"VmHWM:",6);
    if (iVar1 == 0) {
      iVar1 = impl::ParseLine(local_a8);
      file = file + (long)iVar1 * 0x400;
    }
  }
  fclose(__stream);
  return (int64_t)file;
}

Assistant:

int64_t npas4::GetRAMPhysicalUsedByCurrentProcessPeak()
{
#if defined(_WIN32)
	PROCESS_MEMORY_COUNTERS pmc;
	GetProcessMemoryInfo(GetCurrentProcess(), &pmc, sizeof(pmc));
	return static_cast<int64_t>(pmc.PeakWorkingSetSize);
#elif defined(__APPLE__) && defined(__MACH__)
	struct rusage rusage;
	getrusage(RUSAGE_SELF, &rusage);
	return static_cast<int64_t>(rusage.ru_maxrss);
#else
	constexpr int BufferSize{128};
	int64_t result = 0;
	auto file = fopen("/proc/self/status", "r");
	char line[BufferSize];

	while(fgets(line, BufferSize, file) != nullptr)
	{
		if(strncmp(line, "VmHWM:", 6) == 0)
		{
			result += npas4::impl::ParseLine(line) * Kilobytes2Bytes;
		}
	}

	fclose(file);
	return static_cast<int64_t>(result);
#endif
}